

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9FFTest(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  FILE *pFVar3;
  char *pcVar4;
  Gia_Man_t *local_c0;
  FILE *pFile_1;
  FILE *pFile;
  Gia_Man_t *pGStack_88;
  int c;
  Gia_Man_t *pGold;
  char *pFileName;
  Bmc_ParFf_t *pPars;
  Bmc_ParFf_t Pars;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pFileName = (char *)&pPars;
  pGold = (Gia_Man_t *)0x0;
  pGStack_88 = (Gia_Man_t *)0x0;
  Pars._64_8_ = argv;
  Gia_ParFfSetDefault((Bmc_ParFf_t *)pFileName);
  Extra_UtilGetoptReset();
LAB_0026214e:
  do {
    iVar1 = Extra_UtilGetopt(argc,(char **)Pars._64_8_,"ATNKSGkbsfdeunvh");
    if (iVar1 == -1) {
      if ((*(int *)(pFileName + 0x10) == 0) && (*(long *)(pFileName + 8) == 0)) {
        Abc_Print(-1,"Formula string (-S <str>) should be selected when algorithm is 0 (-A 0).\n");
        return 0;
      }
      if ((*(int *)(pFileName + 0x10) != 0) && (*(long *)(pFileName + 8) != 0)) {
        Abc_Print(-1,"Algorithm should be 0 (-A 0) when formula string is selected (-S <str>).\n");
        return 0;
      }
      if (argc == globalUtilOptind + 1) {
        *(undefined8 *)pFileName = *(undefined8 *)(Pars._64_8_ + (long)globalUtilOptind * 8);
        pFVar3 = fopen(*(char **)pFileName,"r");
        if (pFVar3 == (FILE *)0x0) {
          Abc_Print(-1,"Cannot open file \"%s\" with the input test patterns.\n",
                    *(undefined8 *)pFileName);
          return 0;
        }
        fclose(pFVar3);
      }
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9FFTest(): There is no AIG.\n");
        return 0;
      }
      iVar1 = Gia_ManRegNum(pAbc->pGia);
      if ((iVar1 == 0) && (*(int *)(pFileName + 0x10) == 1)) {
        Abc_Print(-1,"Abc_CommandAbc9FFTest(): For delay testing, AIG should be sequential.\n");
        return 0;
      }
      if (pGold != (Gia_Man_t *)0x0) {
        pFVar3 = fopen((char *)pGold,"r");
        if (pFVar3 == (FILE *)0x0) {
          Abc_Print(-1,"Abc_CommandAbc9FFTest(): File name \"%s\" with golden model is invalid.\n",
                    pGold);
          return 0;
        }
        fclose(pFVar3);
        pGStack_88 = Gia_AigerRead((char *)pGold,0,0);
        if (pGStack_88 == (Gia_Man_t *)0x0) {
          Abc_Print(-1,"Abc_CommandAbc9FFTest(): Cannot read file \"%s\" with golden model.\n",pGold
                   );
          return 0;
        }
        iVar1 = Gia_ManPiNum(pAbc->pGia);
        iVar2 = Gia_ManPiNum(pGStack_88);
        if (iVar1 != iVar2) {
          Gia_ManStop(pGStack_88);
          Abc_Print(-1,
                    "Abc_CommandAbc9FFTest(): Old model and gold model have different number of PIs.\n"
                   );
          return 0;
        }
        iVar1 = Gia_ManPoNum(pAbc->pGia);
        iVar2 = Gia_ManPoNum(pGStack_88);
        if (iVar1 != iVar2) {
          Gia_ManStop(pGStack_88);
          Abc_Print(-1,
                    "Abc_CommandAbc9FFTest(): Old model and gold model have different number of POs.\n"
                   );
          return 0;
        }
        printf("Entered spec AIG from file \"%s\".\n",pGold);
      }
      if (pGStack_88 == (Gia_Man_t *)0x0) {
        local_c0 = pAbc->pGia;
      }
      else {
        local_c0 = pGStack_88;
      }
      Gia_ManFaultTest(pAbc->pGia,local_c0,(Bmc_ParFf_t *)pFileName);
      Gia_ManStopP(&stack0xffffffffffffff78);
      return 0;
    }
    switch(iVar1) {
    case 0x41:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-A\" should be followed by an integer.\n");
        goto LAB_002627b8;
      }
      iVar1 = atoi(*(char **)(Pars._64_8_ + (long)globalUtilOptind * 8));
      *(int *)(pFileName + 0x10) = iVar1;
      globalUtilOptind = globalUtilOptind + 1;
      if ((*(int *)(pFileName + 0x10) < 0) || (4 < *(int *)(pFileName + 0x10))) goto LAB_002627b8;
      goto LAB_0026214e;
    default:
      goto LAB_002627b8;
    case 0x47:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-G\" should be followed by string.\n");
        goto LAB_002627b8;
      }
      pGold = *(Gia_Man_t **)(Pars._64_8_ + (long)globalUtilOptind * 8);
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_0026214e;
    case 0x4b:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-K\" should be followed by an integer.\n");
        goto LAB_002627b8;
      }
      iVar1 = atoi(*(char **)(Pars._64_8_ + (long)globalUtilOptind * 8));
      *(int *)(pFileName + 0x24) = iVar1;
      globalUtilOptind = globalUtilOptind + 1;
      if (*(int *)(pFileName + 0x24) < 1) goto LAB_002627b8;
      goto LAB_0026214e;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
        goto LAB_002627b8;
      }
      iVar1 = atoi(*(char **)(Pars._64_8_ + (long)globalUtilOptind * 8));
      *(int *)(pFileName + 0x20) = iVar1;
      iVar1 = *(int *)(pFileName + 0x20);
      break;
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by string.\n");
        goto LAB_002627b8;
      }
      *(undefined8 *)(pFileName + 8) = *(undefined8 *)(Pars._64_8_ + (long)globalUtilOptind * 8);
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_0026214e;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_002627b8;
      }
      iVar1 = atoi(*(char **)(Pars._64_8_ + (long)globalUtilOptind * 8));
      *(int *)(pFileName + 0x1c) = iVar1;
      iVar1 = *(int *)(pFileName + 0x1c);
      break;
    case 0x62:
      *(uint *)(pFileName + 0x2c) = *(uint *)(pFileName + 0x2c) ^ 1;
      goto LAB_0026214e;
    case 100:
      *(uint *)(pFileName + 0x34) = *(uint *)(pFileName + 0x34) ^ 1;
      goto LAB_0026214e;
    case 0x65:
      *(uint *)(pFileName + 0x38) = *(uint *)(pFileName + 0x38) ^ 1;
      goto LAB_0026214e;
    case 0x66:
      *(uint *)(pFileName + 0x30) = *(uint *)(pFileName + 0x30) ^ 1;
      goto LAB_0026214e;
    case 0x68:
      goto LAB_002627b8;
    case 0x6b:
      *(uint *)(pFileName + 0x28) = *(uint *)(pFileName + 0x28) ^ 1;
      goto LAB_0026214e;
    case 0x6e:
      *(uint *)(pFileName + 0x40) = *(uint *)(pFileName + 0x40) ^ 1;
      goto LAB_0026214e;
    case 0x73:
      *(uint *)(pFileName + 0x18) = *(uint *)(pFileName + 0x18) ^ 1;
      goto LAB_0026214e;
    case 0x75:
      *(uint *)(pFileName + 0x3c) = *(uint *)(pFileName + 0x3c) ^ 1;
      goto LAB_0026214e;
    case 0x76:
      *(uint *)(pFileName + 0x44) = *(uint *)(pFileName + 0x44) ^ 1;
      goto LAB_0026214e;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_002627b8:
      Abc_Print(-2,"usage: &fftest [-ATNK num] [-kbsfdeunvh] <file> [-G file] [-S str]\n");
      Abc_Print(-2,"\t          performs functional fault test generation\n");
      Abc_Print(-2,"\t-A num  : selects fault model for all gates [default = %d]\n",
                (ulong)*(uint *)(pFileName + 0x10));
      Abc_Print(-2,"\t                0: fault model is not selected (use -S str)\n");
      Abc_Print(-2,"\t                1: delay fault testing for sequential circuits\n");
      Abc_Print(-2,"\t                2: traditional stuck-at fault: -S (((a&b)&~p)|q)\n");
      Abc_Print(-2,"\t                3: complement fault: -S ((a&b)^p)\n");
      Abc_Print(-2,"\t                4: functionally observable fault\n");
      Abc_Print(-2,"\t-T num  : specifies approximate runtime limit in seconds [default = %d]\n",
                (ulong)*(uint *)(pFileName + 0x1c));
      Abc_Print(-2,"\t-N num  : specifies iteration to check for fixed parameters [default = %d]\n",
                (ulong)*(uint *)(pFileName + 0x20));
      Abc_Print(-2,"\t-K num  : specifies cardinality constraint (num > 0) [default = unused]\n");
      pcVar4 = "no";
      if (*(int *)(pFileName + 0x28) != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,
                "\t-k      : toggles non-strict cardinality (n <= K, instead of n == K) [default = %s]\n"
                ,pcVar4);
      pcVar4 = "no";
      if (*(int *)(pFileName + 0x2c) != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,
                "\t-b      : toggles testing for single faults (the same as \"-K 1\") [default = %s]\n"
                ,pcVar4);
      pcVar4 = "no";
      if (*(int *)(pFileName + 0x18) != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-s      : toggles starting with the all-0 and all-1 patterns [default = %s]\n"
                ,pcVar4);
      pcVar4 = "no";
      if (*(int *)(pFileName + 0x30) != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,
                "\t-f      : toggles faults at flop inputs only with \"-A 1\" and \"-S str\" [default = %s]\n"
                ,pcVar4);
      pcVar4 = "no";
      if (*(int *)(pFileName + 0x34) != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,
                "\t-d      : toggles dumping test patterns into file \"tests.txt\" [default = %s]\n"
                ,pcVar4);
      pcVar4 = "no";
      if (*(int *)(pFileName + 0x38) != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,
                "\t-e      : toggles dumping test pattern pairs (delay faults only) [default = %s]\n"
                ,pcVar4);
      pcVar4 = "no";
      if (*(int *)(pFileName + 0x3c) != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,
                "\t-u      : toggles dumping untestable faults into \"untest.txt\" [default = %s]\n"
                ,pcVar4);
      pcVar4 = "no";
      if (*(int *)(pFileName + 0x40) != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,
                "\t-n      : toggles dumping faults not detected by a given test set [default = %s]\n"
                ,pcVar4);
      pcVar4 = "no";
      if (*(int *)(pFileName + 0x44) != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-v      : toggles printing verbose information [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h      : print the command usage\n");
      Abc_Print(-2,"\t<file>  : (optional) file name with input test patterns\n\n");
      Abc_Print(-2,"\t-G file : (optional) file name with the golden model\n\n");
      Abc_Print(-2,"\t-S str  : (optional) string representing the fault model\n");
      Abc_Print(-2,"\t          The following notations are used:\n");
      Abc_Print(-2,"\t            Functional variables: {a,b} (both a and b are always present)\n");
      Abc_Print(-2,"\t            Parameter variables: {p,q,r,s,t,u,v,w} (any number from 1 to 8)\n"
               );
      Abc_Print(-2,"\t            Boolean operators: AND(&), OR(|), XOR(^), MUX(?:), NOT(~)\n");
      Abc_Print(-2,
                "\t            Parentheses should be used around each operator. Spaces not allowed.\n"
               );
      Abc_Print(-2,
                "\t            Complement (~) is only allowed before variables (use DeMorgan law).\n"
               );
      Abc_Print(-2,"\t            Examples:\n");
      Abc_Print(-2,"\t              (((a&b)&~p)|q)        stuck-at-0/1 at the output\n");
      Abc_Print(-2,"\t              (((a&~p)|q)&b)        stuck-at-0/1 at input a\n");
      Abc_Print(-2,
                "\t              (((a|p)&(b|q))&~r)    stuck-at-1 at the inputs and stuck-at-0 at the output\n"
               );
      Abc_Print(-2,
                "\t              (((a&~p)&(b&~q))|r)   stuck-at-0 at the inputs and stuck-at-1 at the output\n"
               );
      Abc_Print(-2,"\t              ((a&b)^p)             complement at the output\n");
      Abc_Print(-2,
                "\t              (((a^p)&(b^q))^r)     complement at the inputs and at the output\n"
               );
      Abc_Print(-2,
                "\t              (a?(b?~s:r):(b?q:p))  functionally observable fault at the output\n"
               );
      Abc_Print(-2,"\t              (p?(a|b):(a&b))       replace AND by OR\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9FFTest( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ParFfSetDefault( Bmc_ParFf_t * p );
    extern void Gia_ManFaultTest( Gia_Man_t * p, Gia_Man_t * pG, Bmc_ParFf_t * pPars );
    Bmc_ParFf_t Pars, * pPars = &Pars;
    char * pFileName = NULL;
    Gia_Man_t * pGold = NULL;
    int c;
    Gia_ParFfSetDefault( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ATNKSGkbsfdeunvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->Algo = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->Algo < 0 || pPars->Algo > 4 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOut < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nIterCheck = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIterCheck < 0 )
                goto usage;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nCardConstr = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCardConstr <= 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by string.\n" );
                goto usage;
            }
            pPars->pFormStr = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by string.\n" );
                goto usage;
            }
            pFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'k':
            pPars->fNonStrict ^= 1;
            break;
        case 'b':
            pPars->fBasic ^= 1;
            break;
        case 's':
            pPars->fStartPats ^= 1;
            break;
        case 'f':
            pPars->fFfOnly ^= 1;
            break;
        case 'd':
            pPars->fDump ^= 1;
            break;
        case 'e':
            pPars->fDumpDelay ^= 1;
            break;
        case 'u':
            pPars->fDumpUntest ^= 1;
            break;
        case 'n':
            pPars->fDumpNewFaults ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pPars->Algo == 0 && pPars->pFormStr == NULL )
    {
        Abc_Print( -1, "Formula string (-S <str>) should be selected when algorithm is 0 (-A 0).\n" );
        return 0;
    }
    if ( pPars->Algo != 0 && pPars->pFormStr != NULL )
    {
        Abc_Print( -1, "Algorithm should be 0 (-A 0) when formula string is selected (-S <str>).\n" );
        return 0;
    }
    // get the file name
    if ( argc == globalUtilOptind + 1 )
    {
        FILE * pFile;
        pPars->pFileName = argv[globalUtilOptind];
        pFile = fopen( pPars->pFileName, "r" );
        if ( pFile == NULL )
        {
            Abc_Print( -1, "Cannot open file \"%s\" with the input test patterns.\n", pPars->pFileName );
            return 0;
        }
        fclose( pFile );
    }
    // check other conditions
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9FFTest(): There is no AIG.\n" );
        return 0;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 && pPars->Algo == 1 )
    {
        Abc_Print( -1, "Abc_CommandAbc9FFTest(): For delay testing, AIG should be sequential.\n" );
        return 0;
    }
    // check if the file is valid
    if ( pFileName )
    {
        FILE * pFile = fopen( pFileName, "r" );
        if ( pFile == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9FFTest(): File name \"%s\" with golden model is invalid.\n", pFileName );
            return 0;
        }
        fclose( pFile );
        pGold = Gia_AigerRead( pFileName, 0, 0 );
        if ( pGold == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9FFTest(): Cannot read file \"%s\" with golden model.\n", pFileName );
            return 0;
        }
        if ( Gia_ManPiNum(pAbc->pGia) != Gia_ManPiNum(pGold) )
        {
            Gia_ManStop( pGold );
            Abc_Print( -1, "Abc_CommandAbc9FFTest(): Old model and gold model have different number of PIs.\n" );
            return 0;
        }
        if ( Gia_ManPoNum(pAbc->pGia) != Gia_ManPoNum(pGold) )
        {
            Gia_ManStop( pGold );
            Abc_Print( -1, "Abc_CommandAbc9FFTest(): Old model and gold model have different number of POs.\n" );
            return 0;
        }
        printf( "Entered spec AIG from file \"%s\".\n", pFileName );
    }
    Gia_ManFaultTest( pAbc->pGia, pGold ? pGold : pAbc->pGia, pPars );
    Gia_ManStopP( &pGold );
    return 0;

usage:
    Abc_Print( -2, "usage: &fftest [-ATNK num] [-kbsfdeunvh] <file> [-G file] [-S str]\n" );
    Abc_Print( -2, "\t          performs functional fault test generation\n" );
    Abc_Print( -2, "\t-A num  : selects fault model for all gates [default = %d]\n", pPars->Algo );
    Abc_Print( -2, "\t                0: fault model is not selected (use -S str)\n" );
    Abc_Print( -2, "\t                1: delay fault testing for sequential circuits\n" );
    Abc_Print( -2, "\t                2: traditional stuck-at fault: -S (((a&b)&~p)|q)\n" );
    Abc_Print( -2, "\t                3: complement fault: -S ((a&b)^p)\n" );
    Abc_Print( -2, "\t                4: functionally observable fault\n" );
    Abc_Print( -2, "\t-T num  : specifies approximate runtime limit in seconds [default = %d]\n",        pPars->nTimeOut );
    Abc_Print( -2, "\t-N num  : specifies iteration to check for fixed parameters [default = %d]\n",     pPars->nIterCheck );
    Abc_Print( -2, "\t-K num  : specifies cardinality constraint (num > 0) [default = unused]\n" );
    Abc_Print( -2, "\t-k      : toggles non-strict cardinality (n <= K, instead of n == K) [default = %s]\n",pPars->fNonStrict?  "yes": "no" );
    Abc_Print( -2, "\t-b      : toggles testing for single faults (the same as \"-K 1\") [default = %s]\n", pPars->fBasic?      "yes": "no" );
    Abc_Print( -2, "\t-s      : toggles starting with the all-0 and all-1 patterns [default = %s]\n",    pPars->fStartPats?  "yes": "no" );
    Abc_Print( -2, "\t-f      : toggles faults at flop inputs only with \"-A 1\" and \"-S str\" [default = %s]\n",          pPars->fFfOnly?     "yes": "no" );
    Abc_Print( -2, "\t-d      : toggles dumping test patterns into file \"tests.txt\" [default = %s]\n", pPars->fDump?       "yes": "no" );
    Abc_Print( -2, "\t-e      : toggles dumping test pattern pairs (delay faults only) [default = %s]\n", pPars->fDumpDelay? "yes": "no" );
    Abc_Print( -2, "\t-u      : toggles dumping untestable faults into \"untest.txt\" [default = %s]\n", pPars->fDumpUntest? "yes": "no" );
    Abc_Print( -2, "\t-n      : toggles dumping faults not detected by a given test set [default = %s]\n", pPars->fDumpNewFaults? "yes": "no" );
    Abc_Print( -2, "\t-v      : toggles printing verbose information [default = %s]\n",                  pPars->fVerbose?    "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    Abc_Print( -2, "\t<file>  : (optional) file name with input test patterns\n\n");
    Abc_Print( -2, "\t-G file : (optional) file name with the golden model\n\n");
    Abc_Print( -2, "\t-S str  : (optional) string representing the fault model\n");
    Abc_Print( -2, "\t          The following notations are used:\n");
    Abc_Print( -2, "\t            Functional variables: {a,b} (both a and b are always present)\n");
    Abc_Print( -2, "\t            Parameter variables: {p,q,r,s,t,u,v,w} (any number from 1 to 8)\n");
    Abc_Print( -2, "\t            Boolean operators: AND(&), OR(|), XOR(^), MUX(?:), NOT(~)\n");
    Abc_Print( -2, "\t            Parentheses should be used around each operator. Spaces not allowed.\n");
    Abc_Print( -2, "\t            Complement (~) is only allowed before variables (use DeMorgan law).\n");
    Abc_Print( -2, "\t            Examples:\n");
    Abc_Print( -2, "\t              (((a&b)&~p)|q)        stuck-at-0/1 at the output\n");
    Abc_Print( -2, "\t              (((a&~p)|q)&b)        stuck-at-0/1 at input a\n");
    Abc_Print( -2, "\t              (((a|p)&(b|q))&~r)    stuck-at-1 at the inputs and stuck-at-0 at the output\n");
    Abc_Print( -2, "\t              (((a&~p)&(b&~q))|r)   stuck-at-0 at the inputs and stuck-at-1 at the output\n");
    Abc_Print( -2, "\t              ((a&b)^p)             complement at the output\n");
    Abc_Print( -2, "\t              (((a^p)&(b^q))^r)     complement at the inputs and at the output\n");
    Abc_Print( -2, "\t              (a?(b?~s:r):(b?q:p))  functionally observable fault at the output\n");
    Abc_Print( -2, "\t              (p?(a|b):(a&b))       replace AND by OR\n");    
    return 1;
}